

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
mxx::gatherv<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *data,size_t size,
                 int root,comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  size_t local_38;
  
  local_38 = size;
  gather<unsigned_long>(&local_50,&local_38,1,root,comm);
  gatherv<int>(__return_storage_ptr__,data,local_38,&local_50,root,comm);
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    // recv_sizes is unknown -> first collect via gather
    std::vector<size_t> recv_sizes = gather(size, root, comm);
    return gatherv(data, size, recv_sizes, root, comm);
}